

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool substituteImports(value *v)

{
  iterator iVar1;
  bool bVar2;
  _Base_ptr this;
  pointer ppVar3;
  string *psVar4;
  ostream *poVar5;
  object *this_00;
  reference ppVar6;
  undefined1 local_180 [7];
  bool ok;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  i;
  iterator __end3;
  iterator __begin3;
  object *__range3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  local_128;
  undefined1 local_f8 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  impit;
  iterator __end4;
  iterator __begin4;
  object *__range4;
  undefined1 local_a8 [8];
  value importValue;
  undefined1 local_88 [8];
  string importFile;
  allocator local_49;
  key_type local_48;
  _Self local_28;
  iterator it;
  object *o;
  value *v_local;
  
  bVar2 = picojson::value::
          is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                    (v);
  if (bVar2) {
    this = (_Base_ptr)
           picojson::value::
           get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                     (v);
    it._M_node = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"import",&local_49);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    importFile.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                *)it._M_node);
    bVar2 = std::operator!=(&local_28,(_Self *)((long)&importFile.field_2 + 8));
    iVar1 = it;
    if (bVar2) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
               ::operator->(&local_28);
      psVar4 = picojson::value::get<std::__cxx11::string>(&ppVar3->second);
      std::__cxx11::string::string((string *)local_88,(string *)psVar4);
      importValue.u_ =
           (_storage)
           std::
           map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
           ::erase_abi_cxx11_((map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
                               *)it._M_node,(iterator)local_28._M_node);
      picojson::value::value((value *)local_a8);
      bVar2 = loadFileInIncludeDirs((string *)local_88,(value *)local_a8);
      if (bVar2) {
        bVar2 = picojson::value::
                is<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                          ((value *)local_a8);
        if (bVar2) {
          this_00 = picojson::value::
                    get<std::map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>>
                              ((value *)local_a8);
          __end4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   ::begin(this_00);
          impit.second.u_ =
               (_storage)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
               ::end(this_00);
          while (bVar2 = std::operator!=(&__end4,(_Self *)&impit.second.u_), bVar2) {
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                     ::operator*(&__end4);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                    *)local_f8,ppVar6);
            iVar1 = it;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            ::pair<picojson::value_&,_true>
                      (&local_128,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,(value *)((long)&impit.first.field_2 + 8));
            std::
            map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
            ::insert<std::pair<std::__cxx11::string,picojson::value>>
                      ((map<std::__cxx11::string,picojson::value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
                        *)iVar1._M_node,&local_128);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            ::~pair(&local_128);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                     *)local_f8);
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
            ::operator++(&__end4);
          }
        }
        bVar2 = false;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"error: failed \'import\' substitution of \'"
                                );
        poVar5 = std::operator<<(poVar5,(string *)local_88);
        poVar5 = std::operator<<(poVar5,"\'");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        v_local._7_1_ = 0;
        bVar2 = true;
      }
      picojson::value::~value((value *)local_a8);
      std::__cxx11::string::~string((string *)local_88);
      if (bVar2) goto LAB_00136414;
    }
    else {
      __end3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
               ::begin(it._M_node);
      i.second.u_ = (_storage)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)iVar1._M_node);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&i.second.u_), bVar2) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
                 ::operator*(&__end3);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)local_180,ppVar6);
        bVar2 = substituteImports((value *)((long)&i.first.field_2 + 8));
        if (!bVar2) {
          v_local._7_1_ = 0;
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                 *)local_180);
        if (!bVar2) goto LAB_00136414;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>
        ::operator++(&__end3);
      }
    }
  }
  v_local._7_1_ = 1;
LAB_00136414:
  return (bool)(v_local._7_1_ & 1);
}

Assistant:

static bool substituteImports(value *v)
{
    if (v->is<object>()) {
        object &o = v->get<object>();

        auto it = o.find("import");
        if (it != o.end()) {
            std::string importFile = it->second.get<std::string>();
            o.erase(it);

            value importValue;
            if (!loadFileInIncludeDirs(importFile, &importValue)) {
                cerr << "error: failed 'import' substitution of '" << importFile << "'" << endl;
                return false;
            }
            if (importValue.is<object>()) {
                for (auto impit : importValue.get<object>())
                    o.insert(pair<string,value>(impit.first, impit.second));
            }
        } else {
            for (auto i : o) {
                bool ok = substituteImports(&i.second);
                if (!ok)
                    return false;
            }
        }
    }
    return true;
}